

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uname.cpp
# Opt level: O0

string * fs_os_version_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  allocator<char> local_197;
  undefined1 local_196 [8];
  utsname buf;
  
  iVar1 = uname((utsname *)local_196);
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,buf.release + 0x39,&local_197);
    std::allocator<char>::~allocator(&local_197);
  }
  else {
    fs_print_error("","fs_os_version");
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string fs_os_version()
{
// get operating system version
#ifdef HAVE_UTSNAME
  if (struct utsname buf; uname(&buf) == 0)
    return buf.version;
#elif defined(_WIN32)
  OSVERSIONINFOA osvi;
  ZeroMemory(&osvi, sizeof(OSVERSIONINFOA));
  osvi.dwOSVersionInfoSize = sizeof(OSVERSIONINFOA);
  if(GetVersionExA(&osvi))
    return std::to_string(osvi.dwMajorVersion) + '.' + std::to_string(osvi.dwMinorVersion) + '.' + std::to_string(osvi.dwBuildNumber);
#endif

  fs_print_error("", __func__);
  return {};
}